

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::addOutputArgumentConversions
          (TParseContext *this,TFunction *function,TIntermAggregate *intermNode)

{
  TIntermediate *pTVar1;
  TIntermediate *this_00;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppTVar7;
  undefined4 extraout_var_01;
  TType *pTVar8;
  undefined4 extraout_var_02;
  TQualifier *pTVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TIntermSymbol *pTVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar11;
  ulong uVar12;
  undefined4 extraout_var_11;
  TType *pTVar13;
  undefined4 extraout_var_12;
  TTypeParameters *s;
  TVariable *variable;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TIntermSymbol *pTVar14;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  TIntermTyped *pTVar15;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  TIntermSymbol *tempRetNode_1;
  TIntermTyped *tempAssign;
  TIntermSymbol *tempArgNode;
  TIntermTyped *tempAssign_1;
  TIntermSymbol *tempArgNode_1;
  TVariable *tempArg;
  TType paramType;
  int i_1;
  TIntermSymbol *tempRetNode;
  TVariable *tempRet;
  TIntermTyped *conversionTree;
  int i;
  bool outputConversions;
  TIntermSequence *arguments;
  TIntermAggregate *intermNode_local;
  TFunction *function_local;
  TParseContext *this_local;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_01;
  
  iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  this_01 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            CONCAT44(extraout_var,iVar5);
  bVar4 = false;
  conversionTree._0_4_ = 0;
  do {
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
    if (iVar5 <= (int)(uint)conversionTree) {
LAB_00757ae4:
      this_local = (TParseContext *)intermNode;
      if (bVar4) {
        tempRetNode = (TIntermSymbol *)0x0;
        iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x20])();
        tempRet = (TVariable *)intermNode;
        if (iVar5 != 0) {
          iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])();
          tempRetNode = (TIntermSymbol *)
                        makeInternalVariable
                                  (this,"tempReturn",(TType *)CONCAT44(extraout_var_03,iVar5));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)();
          pTVar10 = TIntermediate::addSymbol
                              (pTVar1,(TVariable *)tempRetNode,
                               (TSourceLoc *)CONCAT44(extraout_var_04,iVar5));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)();
          tempRet = (TVariable *)
                    TIntermediate::addAssign
                              (pTVar1,EOpAssign,&pTVar10->super_TIntermTyped,
                               (TIntermTyped *)intermNode,
                               (TSourceLoc *)CONCAT44(extraout_var_05,iVar5));
        }
        tempRet = (TVariable *)
                  TIntermediate::makeAggregate
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             (TIntermNode *)tempRet);
        for (paramType.spirvType._4_4_ = 0; uVar2 = paramType.spirvType._4_4_,
            iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(), (int)uVar2 < iVar5;
            paramType.spirvType._4_4_ = paramType.spirvType._4_4_ + 1) {
          iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])
                            (function,(ulong)paramType.spirvType._4_4_);
          pTVar13 = *(TType **)(CONCAT44(extraout_var_06,iVar5) + 8);
          ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (this_01,(long)(int)paramType.spirvType._4_4_);
          iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
          pTVar8 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0xf0))();
          bVar4 = TType::operator!=(pTVar13,pTVar8);
          if (bVar4) {
            iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])
                              (function,(ulong)paramType.spirvType._4_4_);
            pTVar9 = (TQualifier *)
                     (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar5) + 8) + 0x50))();
            bVar4 = TQualifier::isParamOutput(pTVar9);
            if (bVar4) {
              TType::TType((TType *)&tempArg,EbtVoid,EvqTemporary,1,0,0,false);
              iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])
                                (function,(ulong)paramType.spirvType._4_4_);
              TType::shallowCopy((TType *)&tempArg,*(TType **)(CONCAT44(extraout_var_09,iVar5) + 8))
              ;
              ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](this_01,(long)(int)paramType.spirvType._4_4_);
              iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
              plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar5) + 0xf0))();
              uVar12 = (**(code **)(*plVar11 + 0x188))();
              if (((uVar12 & 1) != 0) && (bVar4 = TType::isParameterized((TType *)&tempArg), !bVar4)
                 ) {
                ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                          operator[](this_01,(long)(int)paramType.spirvType._4_4_);
                iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
                pTVar13 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar5) + 0xf0))();
                TType::shallowCopy((TType *)&tempArg,pTVar13);
                ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                          operator[](this_01,(long)(int)paramType.spirvType._4_4_);
                iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
                plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0xf0))();
                s = (TTypeParameters *)(**(code **)(*plVar11 + 0xb0))();
                TType::copyTypeParameters((TType *)&tempArg,s);
              }
              variable = makeInternalVariable(this,"tempArg",(TType *)&tempArg);
              iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
              pTVar9 = (TQualifier *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar5) + 0x50))();
              TQualifier::makeTemporary(pTVar9);
              iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])
                                (function,(ulong)paramType.spirvType._4_4_);
              pTVar9 = (TQualifier *)
                       (**(code **)(**(long **)(CONCAT44(extraout_var_14,iVar5) + 8) + 0x50))();
              bVar4 = TQualifier::isParamInput(pTVar9);
              if (bVar4) {
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                           _vptr_TIntermNode)();
                pTVar10 = TIntermediate::addSymbol
                                    (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_15,iVar5));
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                          operator[](this_01,(long)(int)paramType.spirvType._4_4_);
                iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
                pTVar14 = (TIntermSymbol *)
                          (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar5) + 0x60))();
                pTVar14 = TIntermediate::addSymbol(this_00,pTVar14);
                ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                          operator[](this_01,(long)(int)paramType.spirvType._4_4_);
                iVar5 = (**(*ppTVar7)->_vptr_TIntermNode)();
                pTVar15 = TIntermediate::addAssign
                                    (pTVar1,EOpAssign,&pTVar10->super_TIntermTyped,
                                     &pTVar14->super_TIntermTyped,
                                     (TSourceLoc *)CONCAT44(extraout_var_17,iVar5));
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                           _vptr_TIntermNode)();
                tempRet = (TVariable *)
                          TIntermediate::mergeAggregate
                                    (pTVar1,&pTVar15->super_TIntermNode,(TIntermNode *)tempRet,
                                     (TSourceLoc *)CONCAT44(extraout_var_18,iVar5));
              }
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                         _vptr_TIntermNode)();
              pTVar10 = TIntermediate::addSymbol
                                  (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_19,iVar5));
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](this_01,(long)(int)paramType.spirvType._4_4_);
              iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
              ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](this_01,(long)(int)paramType.spirvType._4_4_);
              iVar6 = (**(*ppTVar7)->_vptr_TIntermNode)();
              pTVar15 = TIntermediate::addAssign
                                  (pTVar1,EOpAssign,(TIntermTyped *)CONCAT44(extraout_var_20,iVar5),
                                   &pTVar10->super_TIntermTyped,
                                   (TSourceLoc *)CONCAT44(extraout_var_21,iVar6));
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](this_01,(long)(int)paramType.spirvType._4_4_);
              iVar5 = (**(*ppTVar7)->_vptr_TIntermNode)();
              tempRet = (TVariable *)
                        TIntermediate::growAggregate
                                  (pTVar1,(TIntermNode *)tempRet,&pTVar15->super_TIntermNode,
                                   (TSourceLoc *)CONCAT44(extraout_var_22,iVar5));
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                         _vptr_TIntermNode)();
              pTVar10 = TIntermediate::addSymbol
                                  (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_23,iVar5));
              ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](this_01,(long)(int)paramType.spirvType._4_4_);
              *ppTVar7 = (value_type)pTVar10;
              TType::~TType((TType *)&tempArg);
            }
          }
        }
        if (tempRetNode != (TIntermSymbol *)0x0) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)();
          pTVar10 = TIntermediate::addSymbol
                              (pTVar1,(TVariable *)tempRetNode,
                               (TSourceLoc *)CONCAT44(extraout_var_24,iVar5));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)();
          tempRet = (TVariable *)
                    TIntermediate::growAggregate
                              (pTVar1,(TIntermNode *)tempRet,(TIntermNode *)pTVar10,
                               (TSourceLoc *)CONCAT44(extraout_var_25,iVar5));
        }
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        iVar6 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                   _vptr_TIntermNode)();
        this_local = (TParseContext *)
                     TIntermediate::setAggregateOperator
                               (pTVar1,(TIntermNode *)tempRet,EOpComma,
                                (TType *)CONCAT44(extraout_var_26,iVar5),
                                (TSourceLoc *)CONCAT44(extraout_var_27,iVar6));
      }
      return (TIntermTyped *)this_local;
    }
    iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)(uint)conversionTree);
    pTVar13 = *(TType **)(CONCAT44(extraout_var_00,iVar5) + 8);
    ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_01,(long)(int)(uint)conversionTree);
    iVar5 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
    pTVar8 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0xf0))();
    bVar3 = TType::operator!=(pTVar13,pTVar8);
    if (bVar3) {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)(uint)conversionTree)
      ;
      pTVar9 = (TQualifier *)
               (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar5) + 8) + 0x50))();
      bVar3 = TQualifier::isParamOutput(pTVar9);
      if (bVar3) {
        bVar4 = true;
        goto LAB_00757ae4;
      }
    }
    conversionTree._0_4_ = (uint)conversionTree + 1;
  } while( true );
}

Assistant:

TIntermTyped* TParseContext::addOutputArgumentConversions(const TFunction& function, TIntermAggregate& intermNode) const
{
    TIntermSequence& arguments = intermNode.getSequence();

    // Will there be any output conversions?
    bool outputConversions = false;
    for (int i = 0; i < function.getParamCount(); ++i) {
        if (*function[i].type != arguments[i]->getAsTyped()->getType() && function[i].type->getQualifier().isParamOutput()) {
            outputConversions = true;
            break;
        }
    }

    if (! outputConversions)
        return &intermNode;

    // Setup for the new tree, if needed:
    //
    // Output conversions need a different tree topology.
    // Out-qualified arguments need a temporary of the correct type, with the call
    // followed by an assignment of the temporary to the original argument:
    //     void: function(arg, ...)  ->        (          function(tempArg, ...), arg = tempArg, ...)
    //     ret = function(arg, ...)  ->  ret = (tempRet = function(tempArg, ...), arg = tempArg, ..., tempRet)
    // Where the "tempArg" type needs no conversion as an argument, but will convert on assignment.
    TIntermTyped* conversionTree = nullptr;
    TVariable* tempRet = nullptr;
    if (intermNode.getBasicType() != EbtVoid) {
        // do the "tempRet = function(...), " bit from above
        tempRet = makeInternalVariable("tempReturn", intermNode.getType());
        TIntermSymbol* tempRetNode = intermediate.addSymbol(*tempRet, intermNode.getLoc());
        conversionTree = intermediate.addAssign(EOpAssign, tempRetNode, &intermNode, intermNode.getLoc());
    } else
        conversionTree = &intermNode;

    conversionTree = intermediate.makeAggregate(conversionTree);

    // Process each argument's conversion
    for (int i = 0; i < function.getParamCount(); ++i) {
        if (*function[i].type != arguments[i]->getAsTyped()->getType()) {
            if (function[i].type->getQualifier().isParamOutput()) {
                // Out-qualified arguments need to use the topology set up above.
                // do the " ...(tempArg, ...), arg = tempArg" bit from above
                TType paramType;
                paramType.shallowCopy(*function[i].type);
                if (arguments[i]->getAsTyped()->getType().isParameterized() &&
                    !paramType.isParameterized()) {
                    paramType.shallowCopy(arguments[i]->getAsTyped()->getType());
                    paramType.copyTypeParameters(*arguments[i]->getAsTyped()->getType().getTypeParameters());
                }
                TVariable* tempArg = makeInternalVariable("tempArg", paramType);
                tempArg->getWritableType().getQualifier().makeTemporary();
                if (function[i].type->getQualifier().isParamInput()) {
                    // If the parameter is also an input, copy-in.
                    TIntermSymbol* tempArgNode = intermediate.addSymbol(*tempArg, intermNode.getLoc());
                    TIntermTyped* tempAssign = intermediate.addAssign(EOpAssign, tempArgNode, intermediate.addSymbol(*arguments[i]->getAsTyped()->getAsSymbolNode()), arguments[i]->getLoc());
                    conversionTree = intermediate.mergeAggregate(tempAssign, conversionTree, intermNode.getLoc());
                }

                TIntermSymbol* tempArgNode = intermediate.addSymbol(*tempArg, intermNode.getLoc());
                TIntermTyped* tempAssign = intermediate.addAssign(EOpAssign, arguments[i]->getAsTyped(), tempArgNode, arguments[i]->getLoc());
                conversionTree = intermediate.growAggregate(conversionTree, tempAssign, arguments[i]->getLoc());
                // replace the argument with another node for the same tempArg variable
                arguments[i] = intermediate.addSymbol(*tempArg, intermNode.getLoc());
            }
        }
    }

    // Finalize the tree topology (see bigger comment above).
    if (tempRet) {
        // do the "..., tempRet" bit from above
        TIntermSymbol* tempRetNode = intermediate.addSymbol(*tempRet, intermNode.getLoc());
        conversionTree = intermediate.growAggregate(conversionTree, tempRetNode, intermNode.getLoc());
    }
    conversionTree = intermediate.setAggregateOperator(conversionTree, EOpComma, intermNode.getType(), intermNode.getLoc());

    return conversionTree;
}